

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::expansion
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,int max_dim)

{
  pointer pvVar1;
  Siblings *siblings;
  stored_size_type sVar2;
  int iVar3;
  pointer ppVar4;
  pointer ppVar5;
  
  if (1 < max_dim) {
    pvVar1 = (this->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->filtration_vect_).
        super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
      (this->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
    }
    this->dimension_ = max_dim;
    sVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
    iVar3 = max_dim;
    if (sVar2 != 0) {
      ppVar4 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
      ppVar5 = ppVar4;
      do {
        siblings = (ppVar5->second).children_;
        if (siblings->parent_ == ppVar5->first) {
          siblings_expansion(this,siblings,max_dim + -1);
          ppVar4 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
          sVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != ppVar4 + sVar2);
      iVar3 = this->dimension_;
    }
    this->dimension_ = max_dim - iVar3;
  }
  return;
}

Assistant:

void expansion(int max_dim) {
    if (max_dim <= 1) return;
    clear_filtration(); // Drop the cache.
    dimension_ = max_dim;
    for (Dictionary_it root_it = root_.members_.begin();
         root_it != root_.members_.end(); ++root_it) {
      if (has_children(root_it)) {
        siblings_expansion(root_it->second.children(), max_dim - 1);
      }
    }
    dimension_ = max_dim - dimension_;
  }